

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_view.cpp
# Opt level: O1

bool ViewHdd(string *path,Range range)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  exception *this;
  int iVar7;
  int iVar8;
  long sector;
  long lVar9;
  shared_ptr<HDD> hdd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint8_t *local_58;
  undefined1 local_50 [16];
  Range local_40;
  
  local_40._8_8_ = range._8_8_;
  local_40._0_8_ = range._0_8_;
  HDD::OpenDisk((HDD *)local_50,path);
  if ((HDD *)local_50._0_8_ == (HDD *)0x0) {
    Error("open");
  }
  bVar2 = Range::empty(&local_40);
  if (!bVar2) {
    iVar3 = Range::cyls(&local_40);
    if (iVar3 != 1) {
LAB_00152354:
      this = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[34]>
                (this,(char (*) [34])"HDD view ranges are not supported");
      __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = Range::heads(&local_40);
    if (iVar3 != 1) goto LAB_00152354;
  }
  iVar3 = *(int *)(local_50._0_8_ + 0x18);
  local_58 = AllocMem(iVar3);
  lVar1 = opt.sectors;
  iVar8 = local_40.cyl_begin;
  iVar7 = local_40.head_begin;
  lVar9 = 0;
  if (0 < opt.sectors) {
    lVar9 = opt.sectors;
  }
  bVar2 = Range::empty(&local_40);
  sector = lVar9;
  if (bVar2) {
LAB_00152155:
    if (*(int64_t *)(local_50._0_8_ + 0x20) <= sector) {
      util::fmt_abi_cxx11_(&local_78,"LBA value out of drive range (%u sectors).\n");
      util::operator<<((LogHelper *)&util::cout,&local_78);
      goto LAB_0015225c;
    }
    bVar2 = HDD::Seek((HDD *)local_50._0_8_,sector);
    if (bVar2) {
      iVar4 = HDD::Read((HDD *)local_50._0_8_,local_58,1,false);
      if (iVar4 != 0) {
        bVar2 = Range::empty(&local_40);
        if (bVar2) {
          util::fmt_abi_cxx11_(&local_78,"LBA Sector %u (%u bytes):\n\n",sector);
          util::operator<<((LogHelper *)&util::cout,&local_78);
        }
        else {
          pcVar5 = CylStr(iVar8);
          pcVar6 = HeadStr(iVar7);
          util::fmt_abi_cxx11_
                    (&local_78,"Cyl %s Head %s Sector %u (LBA %s):\n",pcVar5,pcVar6,lVar9,sector);
          util::operator<<((LogHelper *)&util::cout,&local_78);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        iVar8 = opt.bytes_begin;
        if (opt.bytes_begin < 1) {
          iVar8 = 0;
        }
        iVar7 = opt.bytes_end;
        if (iVar3 < opt.bytes_end) {
          iVar7 = iVar3;
        }
        if (opt.bytes_end < 0) {
          iVar7 = iVar3;
        }
        bVar2 = true;
        util::hex_dump<unsigned_char*>(local_58,local_58 + iVar7,iVar8,(colour *)0x0,0x10);
        goto LAB_00152287;
      }
    }
    Error("read");
  }
  else {
    if ((((iVar8 < *(int *)(local_50._0_8_ + 0xc)) && (iVar7 < *(int *)(local_50._0_8_ + 0x10))) &&
        (0 < lVar1)) && (lVar9 <= *(int *)(local_50._0_8_ + 0x14))) {
      sector = lVar9 + (long)*(int *)(local_50._0_8_ + 0x14) *
                       (long)(*(int *)(local_50._0_8_ + 0x10) * iVar8 + iVar7) + -1;
      goto LAB_00152155;
    }
    util::fmt_abi_cxx11_
              (&local_78,"Invalid CHS address for drive (Cyl 0-%d, Head 0-%u, Sector 1-%u)\n",
               (ulong)(*(int *)(local_50._0_8_ + 0xc) - 1),
               (ulong)(*(int *)(local_50._0_8_ + 0x10) - 1),
               (ulong)(uint)*(int *)(local_50._0_8_ + 0x14));
    util::operator<<((LogHelper *)&util::cout,&local_78);
LAB_0015225c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = false;
LAB_00152287:
  FreeMem(local_58);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  return bVar2;
}

Assistant:

bool ViewHdd(const std::string& path, Range range)
{
    auto hdd = HDD::OpenDisk(path);
    if (!hdd)
        Error("open");

    if (!range.empty() && (range.cyls() != 1 || range.heads() != 1))
        throw util::exception("HDD view ranges are not supported");

    MEMORY mem(hdd->sector_size);

    auto cyl = range.cyl_begin;
    auto head = range.head_begin;
    auto sector = (opt.sectors < 0) ? 0 : opt.sectors;
    auto lba_sector = sector;

    if (!range.empty())
    {
        if (cyl >= hdd->cyls || head >= hdd->heads || sector > hdd->sectors || !sector)
        {
            util::cout << util::fmt("Invalid CHS address for drive (Cyl 0-%d, Head 0-%u, Sector 1-%u)\n",
                hdd->cyls - 1, hdd->heads - 1, hdd->sectors);
            return false;
        }

        // Convert CHS address to LBA
        lba_sector = (cyl * hdd->heads + head) * hdd->sectors + (sector - 1);
    }

    if (lba_sector >= hdd->total_sectors)
        util::cout << util::fmt("LBA value out of drive range (%u sectors).\n", hdd->total_sectors);
    else if (!hdd->Seek(lba_sector) || !hdd->Read(mem, 1))
        Error("read");
    else
    {
        if (!range.empty())
            util::cout << util::fmt("Cyl %s Head %s Sector %u (LBA %s):\n", CylStr(cyl), HeadStr(head), sector, lba_sector);
        else
            util::cout << util::fmt("LBA Sector %u (%u bytes):\n\n", lba_sector, mem.size);

        auto show_begin = std::max(opt.bytes_begin, 0);
        auto show_end = (opt.bytes_end < 0) ? mem.size :
            std::min(opt.bytes_end, mem.size);
        util::hex_dump(mem.pb, mem.pb + show_end, show_begin);
        return true;
    }

    return false;
}